

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::getCore(Federate *this,FederateInfo *fedInfo)

{
  shared_ptr<helics::Core> *this_00;
  CoreType CVar1;
  char *pcVar2;
  pointer pcVar3;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  int iVar5;
  size_type __n;
  RegistrationFailure *this_02;
  FederateInfo *fedInfo_00;
  FederateInfo *extraout_RDX;
  FederateInfo *extraout_RDX_00;
  FederateInfo *extraout_RDX_01;
  FederateInfo *pFVar6;
  FederateInfo *fedInfo_01;
  string *this_03;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view coreName;
  string_view coreName_00;
  string_view coreName_01;
  string_view message;
  string_view coreName_02;
  string_view message_00;
  string_view configureString;
  string_view configureString_00;
  string_view configureString_01;
  string_view configureString_02;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string_view configureString_03;
  _Alloc_hider in_stack_ffffffffffffff28;
  _Alloc_hider length;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string cname;
  string local_98;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *local_78;
  size_type local_70;
  undefined8 uStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_03 = (string *)&stack0xffffffffffffff28;
  bVar4 = FederateInfo::checkFlagProperty(fedInfo,0x1b,false);
  this->singleThreadFederate = bVar4;
  if ((this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  this_00 = &this->coreObject;
  pcVar2 = (char *)(fedInfo->coreName)._M_string_length;
  if (pcVar2 == (char *)0x0) {
    pFVar6 = fedInfo_00;
    if (fedInfo->forceNewCore == false) {
      CoreFactory::findJoinableCoreOfType((CoreType)&stack0xffffffffffffff28);
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff28)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
      pFVar6 = extraout_RDX;
      if ((this_00->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        return;
      }
    }
    if ((this->mName)._M_string_length != 0) {
      gmlc::utilities::randomString_abi_cxx11_((size_type)in_stack_ffffffffffffff28._M_p);
      length._M_p = (this->mName)._M_dataplus._M_p;
      _Stack_d0._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->mName)._M_string_length;
      local_c8._M_allocated_capacity = (size_type)local_98._M_dataplus._M_p;
      local_c8._8_8_ = local_98._M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&stack0xffffffffffffff28;
      fmt.size_ = 0xdd;
      fmt.data_ = (char *)0xa;
      ::fmt::v11::vformat_abi_cxx11_(&cname,(v11 *)"{}_core_{}",fmt,args);
      std::__cxx11::string::~string((string *)&local_98);
      __n = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
                 "${",0);
      pFVar6 = extraout_RDX_00;
      if (__n != 0xffffffffffffffff) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName
                   ,0,__n);
        gmlc::utilities::randomString_abi_cxx11_((size_type)length._M_p);
        _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length;
        local_c8._M_allocated_capacity = local_70;
        local_c8._8_8_ = uStack_68;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&stack0xffffffffffffff28;
        fmt_00.size_ = 0xdd;
        fmt_00.data_ = (char *)0xa;
        ::fmt::v11::vformat_abi_cxx11_(&local_98,(v11 *)"{}_core_{}",fmt_00,args_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cname,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        pFVar6 = extraout_RDX_01;
      }
      CVar1 = fedInfo->coreType;
      generateFullCoreInitString_abi_cxx11_
                ((string *)&stack0xffffffffffffff28,(helics *)fedInfo,pFVar6);
      coreName_00._M_len = (ulong)CVar1;
      coreName_00._M_str = (char *)cname._M_string_length;
      configureString_00._M_str = (char *)_Stack_d0._M_pi;
      configureString_00._M_len = (size_t)cname._M_dataplus._M_p;
      CoreFactory::create((CoreType)&local_98,coreName_00,configureString_00);
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      this_03 = &cname;
      goto LAB_001a88ef;
    }
    CVar1 = fedInfo->coreType;
    generateFullCoreInitString_abi_cxx11_
              ((string *)&stack0xffffffffffffff28,(helics *)fedInfo,pFVar6);
    configureString_03._M_str = in_stack_ffffffffffffff28._M_p;
    configureString_03._M_len = (size_t)_Stack_d0._M_pi;
    CoreFactory::create((CoreFactory *)&cname,CVar1,configureString_03);
  }
  else {
    if (fedInfo->forceNewCore == false) {
      CVar1 = fedInfo->coreType;
      pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
      local_78 = &this_00->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
      generateFullCoreInitString_abi_cxx11_
                ((string *)&stack0xffffffffffffff28,(helics *)fedInfo,fedInfo_00);
      coreName_01._M_len = (ulong)CVar1;
      coreName_01._M_str = pcVar2;
      configureString_01._M_str = (char *)_Stack_d0._M_pi;
      configureString_01._M_len = (size_t)pcVar3;
      CoreFactory::FindOrCreate((CoreType)&cname,coreName_01,configureString_01);
      this_01 = local_78;
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
                (local_78,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&cname);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cname._M_string_length);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      iVar5 = (*this_01->_M_ptr->_vptr_Core[0xb])();
      if ((char)iVar5 != '\0') {
        return;
      }
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
                         &stack0xffffffffffffff28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
      message._M_str = "found core object is not open";
      message._M_len = 0x1d;
      logWarningMessage(this,message);
      CoreFactory::cleanUpCores((milliseconds)0xc8);
      CVar1 = fedInfo->coreType;
      pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
      pcVar2 = (char *)(fedInfo->coreName)._M_string_length;
      generateFullCoreInitString_abi_cxx11_
                ((string *)&stack0xffffffffffffff28,(helics *)fedInfo,fedInfo_01);
      coreName_02._M_len = (ulong)CVar1;
      coreName_02._M_str = pcVar2;
      configureString_02._M_str = (char *)_Stack_d0._M_pi;
      configureString_02._M_len = (size_t)pcVar3;
      CoreFactory::FindOrCreate((CoreType)&cname,coreName_02,configureString_02);
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&cname);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cname._M_string_length);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      iVar5 = (*this_01->_M_ptr->_vptr_Core[0xb])();
      if ((char)iVar5 != '\0') {
        return;
      }
      this_02 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
      message_00._M_str = "Unable to connect to specified core: core is not open to new Federates";
      message_00._M_len = 0x46;
      RegistrationFailure::RegistrationFailure(this_02,message_00);
      __cxa_throw(this_02,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
    }
    CVar1 = fedInfo->coreType;
    pcVar3 = (fedInfo->coreName)._M_dataplus._M_p;
    generateFullCoreInitString_abi_cxx11_
              ((string *)&stack0xffffffffffffff28,(helics *)fedInfo,fedInfo_00);
    coreName._M_len = (ulong)CVar1;
    coreName._M_str = pcVar2;
    configureString._M_str = (char *)_Stack_d0._M_pi;
    configureString._M_len = (size_t)pcVar3;
    CoreFactory::create((CoreType)&cname,coreName,configureString);
  }
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&cname);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cname._M_string_length);
LAB_001a88ef:
  std::__cxx11::string::~string((string *)this_03);
  return;
}

Assistant:

void Federate::getCore(const FederateInfo& fedInfo)
{
    singleThreadFederate = fedInfo.checkFlagProperty(defs::Flags::SINGLE_THREAD_FEDERATE, false);
    if (coreObject) {
        return;
    }

    if (fedInfo.coreName.empty()) {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::findJoinableCoreOfType(fedInfo.coreType);
        }
        if (!coreObject) {
            if (!mName.empty()) {
                std::string cname =
                    fmt::format("{}_core_{}", mName, gmlc::utilities::randomString(6));
                auto loc = mName.find("${");
                if (loc != std::string::npos) {
                    cname = fmt::format("{}_core_{}",
                                        mName.substr(0, loc),
                                        gmlc::utilities::randomString(8));
                }
                try {
                    coreObject = CoreFactory::create(fedInfo.coreType,
                                                     cname,
                                                     generateFullCoreInitString(fedInfo));
                }
                catch (const helics::RegistrationFailure&) {
                    // there is a possibility of race condition here in the naming resulting a
                    // failure this catches and reverts to previous naming which is fully randomly
                    // generated
                    coreObject =
                        CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
                }
            } else {
                coreObject =
                    CoreFactory::create(fedInfo.coreType, generateFullCoreInitString(fedInfo));
            }
        }
    } else {
        if (!fedInfo.forceNewCore) {
            coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                   fedInfo.coreName,
                                                   generateFullCoreInitString(fedInfo));
            if (!coreObject->isOpenToNewFederates()) {
                coreObject = nullptr;
                logWarningMessage("found core object is not open");
                CoreFactory::cleanUpCores(200ms);
                coreObject = CoreFactory::FindOrCreate(fedInfo.coreType,
                                                       fedInfo.coreName,
                                                       generateFullCoreInitString(fedInfo));
                if (!coreObject->isOpenToNewFederates()) {
                    throw(RegistrationFailure(
                        "Unable to connect to specified core: core is not open to new Federates"));
                }
            }
        } else {
            coreObject = CoreFactory::create(fedInfo.coreType,
                                             fedInfo.coreName,
                                             generateFullCoreInitString(fedInfo));
        }
    }
}